

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void cmsys::SystemTools::ClassInitialize(void)

{
  bool bVar1;
  __type _Var2;
  SystemToolsTranslationMap *this;
  char *pcVar3;
  ulong uVar4;
  bool local_9d1;
  allocator<char> local_981;
  string local_980;
  string local_960;
  string local_940;
  allocator<char> local_919;
  string local_918;
  undefined1 local_8f8 [8];
  string pwd_path;
  undefined1 local_8d0 [8];
  string cwd_str;
  string pwd_changed;
  string cwd_changed;
  char *cwd;
  char buf [2048];
  undefined1 local_60 [8];
  string pwd_str;
  allocator<char> local_29;
  string local_28;
  
  this = (SystemToolsTranslationMap *)operator_new(0x30);
  SystemToolsTranslationMap::SystemToolsTranslationMap(this);
  TranslationMap = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"/tmp/",&local_29);
  AddKeepPath(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator(&local_29);
  std::__cxx11::string::string((string *)local_60);
  bVar1 = GetEnv("PWD",(string *)local_60);
  if ((bVar1) && (pcVar3 = Getcwd((char *)&cwd,0x800), pcVar3 != (char *)0x0)) {
    std::__cxx11::string::string((string *)(pwd_changed.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(cwd_str.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_8d0,pcVar3,(allocator<char> *)(pwd_path.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(pwd_path.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)local_8f8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_918,pcVar3,&local_919);
    Realpath(&local_918,(string *)local_8f8,(string *)0x0);
    std::__cxx11::string::~string((string *)&local_918);
    std::allocator<char>::~allocator(&local_919);
    while( true ) {
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_8d0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_8f8);
      local_9d1 = false;
      if (_Var2) {
        local_9d1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_8d0,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_60);
      }
      if (local_9d1 == false) break;
      std::__cxx11::string::operator=
                ((string *)(pwd_changed.field_2._M_local_buf + 8),(string *)local_8d0);
      std::__cxx11::string::operator=
                ((string *)(cwd_str.field_2._M_local_buf + 8),(string *)local_60);
      GetFilenamePath(&local_940,(string *)local_60);
      std::__cxx11::string::operator=((string *)local_60,(string *)&local_940);
      std::__cxx11::string::~string((string *)&local_940);
      GetFilenamePath(&local_960,(string *)local_8d0);
      std::__cxx11::string::operator=((string *)local_8d0,(string *)&local_960);
      std::__cxx11::string::~string((string *)&local_960);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_980,pcVar3,&local_981);
      Realpath(&local_980,(string *)local_8f8,(string *)0x0);
      std::__cxx11::string::~string((string *)&local_980);
      std::allocator<char>::~allocator(&local_981);
    }
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
      AddTranslationPath((string *)((long)&pwd_changed.field_2 + 8),
                         (string *)((long)&cwd_str.field_2 + 8));
    }
    std::__cxx11::string::~string((string *)local_8f8);
    std::__cxx11::string::~string((string *)local_8d0);
    std::__cxx11::string::~string((string *)(cwd_str.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(pwd_changed.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void SystemTools::ClassInitialize()
{
#ifdef __VMS
  SetVMSFeature("DECC$FILENAME_UNIX_ONLY", 1);
#endif
  // Allocate the translation map first.
  SystemTools::TranslationMap = new SystemToolsTranslationMap;
#ifdef _WIN32
  SystemTools::PathCaseMap = new SystemToolsPathCaseMap;
  SystemTools::EnvMap = new SystemToolsEnvMap;
#endif
#ifdef __CYGWIN__
  SystemTools::Cyg2Win32Map = new SystemToolsTranslationMap;
#endif

// Add some special translation paths for unix.  These are not added
// for windows because drive letters need to be maintained.  Also,
// there are not sym-links and mount points on windows anyway.
#if !defined(_WIN32) || defined(__CYGWIN__)
  // The tmp path is frequently a logical path so always keep it:
  SystemTools::AddKeepPath("/tmp/");

  // If the current working directory is a logical path then keep the
  // logical name.
  std::string pwd_str;
  if (SystemTools::GetEnv("PWD", pwd_str)) {
    char buf[2048];
    if (const char* cwd = Getcwd(buf, 2048)) {
      // The current working directory may be a logical path.  Find
      // the shortest logical path that still produces the correct
      // physical path.
      std::string cwd_changed;
      std::string pwd_changed;

      // Test progressively shorter logical-to-physical mappings.
      std::string cwd_str = cwd;
      std::string pwd_path;
      Realpath(pwd_str.c_str(), pwd_path);
      while (cwd_str == pwd_path && cwd_str != pwd_str) {
        // The current pair of paths is a working logical mapping.
        cwd_changed = cwd_str;
        pwd_changed = pwd_str;

        // Strip off one directory level and see if the logical
        // mapping still works.
        pwd_str = SystemTools::GetFilenamePath(pwd_str);
        cwd_str = SystemTools::GetFilenamePath(cwd_str);
        Realpath(pwd_str.c_str(), pwd_path);
      }

      // Add the translation to keep the logical path name.
      if (!cwd_changed.empty() && !pwd_changed.empty()) {
        SystemTools::AddTranslationPath(cwd_changed, pwd_changed);
      }
    }
  }
#endif
}